

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

void recff_math_minmax(jit_State *J,RecordFFData *rd)

{
  TRef TVar1;
  long in_RSI;
  long in_RDI;
  IRType t;
  TRef tr2;
  BCReg i;
  uint32_t op;
  TRef tr;
  TRef in_stack_ffffffffffffffac;
  TRef in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  uint uVar2;
  int iVar3;
  
  TVar1 = lj_ir_tonumber((jit_State *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                         in_stack_ffffffffffffffac);
  iVar3 = *(int *)(in_RSI + 0x10);
  uVar2 = 1;
  while (*(int *)(*(long *)(in_RDI + 0x88) + (ulong)uVar2 * 4) != 0) {
    in_stack_ffffffffffffffb0 =
         lj_ir_tonumber((jit_State *)CONCAT44(uVar2,in_stack_ffffffffffffffb0),
                        in_stack_ffffffffffffffac);
    in_stack_ffffffffffffffac = 0x13;
    if ((4 < (TVar1 >> 0x18 & 0x1f) - 0xf) || (4 < (in_stack_ffffffffffffffb0 >> 0x18 & 0x1f) - 0xf)
       ) {
      if ((TVar1 >> 0x18 & 0x1f) - 0xf < 5) {
        *(undefined2 *)(in_RDI + 0xa4) = 0x590e;
        *(short *)(in_RDI + 0xa0) = (short)TVar1;
        *(undefined2 *)(in_RDI + 0xa2) = 0x1d3;
        TVar1 = lj_opt_fold((jit_State *)CONCAT44(TVar1,iVar3));
      }
      if ((in_stack_ffffffffffffffb0 >> 0x18 & 0x1f) - 0xf < 5) {
        *(undefined2 *)(in_RDI + 0xa4) = 0x590e;
        *(short *)(in_RDI + 0xa0) = (short)in_stack_ffffffffffffffb0;
        *(undefined2 *)(in_RDI + 0xa2) = 0x1d3;
        in_stack_ffffffffffffffb0 = lj_opt_fold((jit_State *)CONCAT44(TVar1,iVar3));
      }
      in_stack_ffffffffffffffac = 0xe;
    }
    *(ushort *)(in_RDI + 0xa4) = (ushort)(iVar3 << 8) | (ushort)in_stack_ffffffffffffffac;
    *(short *)(in_RDI + 0xa0) = (short)TVar1;
    *(short *)(in_RDI + 0xa2) = (short)in_stack_ffffffffffffffb0;
    TVar1 = lj_opt_fold((jit_State *)CONCAT44(TVar1,iVar3));
    uVar2 = uVar2 + 1;
  }
  **(TRef **)(in_RDI + 0x88) = TVar1;
  return;
}

Assistant:

static void LJ_FASTCALL recff_math_minmax(jit_State *J, RecordFFData *rd)
{
  TRef tr = lj_ir_tonumber(J, J->base[0]);
  uint32_t op = rd->data;
  BCReg i;
  for (i = 1; J->base[i] != 0; i++) {
    TRef tr2 = lj_ir_tonumber(J, J->base[i]);
    IRType t = IRT_INT;
    if (!(tref_isinteger(tr) && tref_isinteger(tr2))) {
      if (tref_isinteger(tr)) tr = emitir(IRTN(IR_CONV), tr, IRCONV_NUM_INT);
      if (tref_isinteger(tr2)) tr2 = emitir(IRTN(IR_CONV), tr2, IRCONV_NUM_INT);
      t = IRT_NUM;
    }
    tr = emitir(IRT(op, t), tr, tr2);
  }
  J->base[0] = tr;
}